

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O0

void __thiscall deci::dictionary_t::dictionary_t(dictionary_t *this,dictionary_t *copy)

{
  bool bVar1;
  int iVar2;
  size_type __n;
  reference pvVar3;
  undefined4 extraout_var;
  pair<deci::value_t_*,_deci::value_t_*> pVar4;
  pair<deci::value_t_*,_deci::value_t_*> local_78;
  value_t *local_68;
  value_t *value;
  value_t *key;
  value_type el;
  _Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true> local_40;
  const_iterator __end1;
  const_iterator __begin1;
  storage_t *__range1;
  dictionary_t *copy_local;
  dictionary_t *this_local;
  
  value_t::value_t(&this->super_value_t);
  (this->super_value_t)._vptr_value_t = (_func_int **)&PTR_DoHashing_0011dcf0;
  *(undefined8 *)&(this->storage)._M_h._M_rehash_policy = 0;
  (this->storage)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->storage)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->storage)._M_h._M_element_count = 0;
  (this->storage)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->storage)._M_h._M_bucket_count = 0;
  (this->storage)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
  ::unordered_map(&this->storage);
  __n = std::
        unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
        ::size(&copy->storage);
  std::
  unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
  ::reserve(&this->storage,__n);
  __end1 = std::
           unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
           ::begin(&copy->storage);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<deci::value_t_*,_deci::value_t_*,_deci::value_hash_t,_deci::value_equal_to_t,_std::allocator<std::pair<deci::value_t_*const,_deci::value_t_*>_>_>
       ::end(&copy->storage);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<deci::value_t_*const,_deci::value_t_*>,_true>
                       ,&local_40);
    if (!bVar1) break;
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>::
             operator*(&__end1);
    key._0_4_ = *(undefined4 *)&pvVar3->first;
    key._4_4_ = *(undefined4 *)((long)&pvVar3->first + 4);
    el.first._0_4_ = *(undefined4 *)&pvVar3->second;
    el.first._4_4_ = *(undefined4 *)((long)&pvVar3->second + 4);
    iVar2 = (*pvVar3->first->_vptr_value_t[2])();
    value = (value_t *)CONCAT44(extraout_var,iVar2);
    local_68 = (value_t *)(**(code **)(*(long *)CONCAT44(el.first._4_4_,el.first._0_4_) + 0x10))();
    pVar4 = std::make_pair<deci::value_t*&,deci::value_t*&>(&value,&local_68);
    local_78 = pVar4;
    std::
    unordered_map<deci::value_t*,deci::value_t*,deci::value_hash_t,deci::value_equal_to_t,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>>
    ::insert<std::pair<deci::value_t*,deci::value_t*>>
              ((unordered_map<deci::value_t*,deci::value_t*,deci::value_hash_t,deci::value_equal_to_t,std::allocator<std::pair<deci::value_t*const,deci::value_t*>>>
                *)&this->storage,&local_78);
    std::__detail::
    _Node_const_iterator<std::pair<deci::value_t_*const,_deci::value_t_*>,_false,_true>::operator++
              (&__end1);
  }
  return;
}

Assistant:

dictionary_t::dictionary_t(const dictionary_t& copy):value_t(), storage() {
    this->storage.reserve(copy.storage.size());
    for (auto el: copy.storage) {
      value_t* key = el.first->Copy();
      value_t* value = el.second->Copy();
      this->storage.insert(std::make_pair(key,value));
    }
  }